

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

uint16_t icu_63::expandName(UCharNames *names,uint8_t *name,uint16_t nameLength,
                           UCharNameChoice nameChoice,char *buffer,uint16_t bufferLength)

{
  ushort uVar1;
  uint uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  UCharNameChoice UVar5;
  byte bVar6;
  uint16_t uVar7;
  ushort uVar8;
  byte *pbVar9;
  byte *pbVar10;
  bool bVar11;
  
  uVar1 = (ushort)names[1].tokenStringOffset;
  uVar2 = names->tokenStringOffset;
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) == U_UNICODE_CHAR_NAME) {
LAB_002ea742:
    if (nameLength != 0) {
      uVar4 = 0;
LAB_002ea75f:
      do {
        uVar7 = nameLength - 1;
        pbVar9 = name + 1;
        bVar6 = *name;
        uVar3 = uVar4;
        if (bVar6 < uVar1) {
          uVar8 = *(ushort *)((long)&names[1].tokenStringOffset + (ulong)(ushort)bVar6 * 2 + 2);
          if (uVar8 == 0xfffe) {
            pbVar9 = name + 2;
            uVar8 = *(ushort *)
                     ((long)&names[1].tokenStringOffset +
                     (ulong)((uint)(ushort)bVar6 * 0x200 + (uint)name[1] * 2) + 2);
            uVar7 = nameLength - 2;
          }
          nameLength = uVar7;
          if (uVar8 == 0xffff) {
            uVar7 = nameLength;
            if (bVar6 != 0x3b) goto LAB_002ea7db;
            if ((nameChoice != U_EXTENDED_CHAR_NAME) || (uVar4 != 0)) break;
            uVar4 = 0;
            uVar3 = uVar4;
            if (((short)names[8].groupStringOffset != -1) ||
               (name = pbVar9, uVar3 = 0, nameLength == 0)) break;
            goto LAB_002ea75f;
          }
          bVar6 = *(byte *)((long)&names->tokenStringOffset + (ulong)uVar8 + (ulong)uVar2);
          if (bVar6 != 0) {
            pbVar10 = (byte *)((long)&names->tokenStringOffset + (ulong)uVar8 + (ulong)uVar2 + 1);
            do {
              if (bufferLength == 0) {
                bufferLength = 0;
              }
              else {
                *buffer = bVar6;
                buffer = (char *)((byte *)buffer + 1);
                bufferLength = bufferLength - 1;
              }
              uVar4 = uVar4 + 1;
              bVar6 = *pbVar10;
              pbVar10 = pbVar10 + 1;
            } while (bVar6 != 0);
          }
        }
        else {
          if (bVar6 == 0x3b) break;
LAB_002ea7db:
          if (bufferLength == 0) {
            bufferLength = 0;
          }
          else {
            *buffer = bVar6;
            buffer = (char *)((byte *)buffer + 1);
            bufferLength = bufferLength - 1;
          }
          uVar4 = uVar4 + 1;
          nameLength = uVar7;
        }
        name = pbVar9;
        uVar3 = uVar4;
      } while (nameLength != 0);
      goto LAB_002ea832;
    }
  }
  else {
    UVar5 = nameChoice;
    if ((uVar1 < 0x3c) || ((short)names[8].groupStringOffset == -1)) {
      do {
        uVar4 = nameLength;
        if (nameLength == 0) {
          nameLength = 0;
        }
        else {
          do {
            nameLength = uVar4 - 1;
            bVar6 = *name;
            name = name + 1;
            if (bVar6 == 0x3b) break;
            bVar11 = uVar4 != 1;
            uVar4 = nameLength;
          } while (bVar11);
        }
        bVar11 = 1 < (int)UVar5;
        UVar5 = UVar5 - U_UNICODE_10_CHAR_NAME;
      } while (bVar11);
      goto LAB_002ea742;
    }
  }
  uVar3 = 0;
LAB_002ea832:
  if (bufferLength != 0) {
    *buffer = 0;
  }
  return uVar3;
}

Assistant:

static uint16_t
expandName(UCharNames *names,
           const uint8_t *name, uint16_t nameLength, UCharNameChoice nameChoice,
           char *buffer, uint16_t bufferLength) {
    uint16_t *tokens=(uint16_t *)names+8;
    uint16_t token, tokenCount=*tokens++, bufferPos=0;
    uint8_t *tokenStrings=(uint8_t *)names+names->tokenStringOffset;
    uint8_t c;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        /*
         * skip the modern name if it is not requested _and_
         * if the semicolon byte value is a character, not a token number
         */
        if((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
            int fieldIndex= nameChoice==U_ISO_COMMENT ? 2 : nameChoice;
            do {
                while(nameLength>0) {
                    --nameLength;
                    if(*name++==';') {
                        break;
                    }
                }
            } while(--fieldIndex>0);
        } else {
            /*
             * the semicolon byte value is a token number, therefore
             * only modern names are stored in unames.dat and there is no
             * such requested alternate name here
             */
            nameLength=0;
        }
    }

    /* write each letter directly, and write a token word per token */
    while(nameLength>0) {
        --nameLength;
        c=*name++;

        if(c>=tokenCount) {
            if(c!=';') {
                /* implicit letter */
                WRITE_CHAR(buffer, bufferLength, bufferPos, c);
            } else {
                /* finished */
                break;
            }
        } else {
            token=tokens[c];
            if(token==(uint16_t)(-2)) {
                /* this is a lead byte for a double-byte token */
                token=tokens[c<<8|*name++];
                --nameLength;
            }
            if(token==(uint16_t)(-1)) {
                if(c!=';') {
                    /* explicit letter */
                    WRITE_CHAR(buffer, bufferLength, bufferPos, c);
                } else {
                    /* stop, but skip the semicolon if we are seeking
                       extended names and there was no 2.0 name but there
                       is a 1.0 name. */
                    if(!bufferPos && nameChoice == U_EXTENDED_CHAR_NAME) {
                        if ((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
                            continue;
                        }
                    }
                    /* finished */
                    break;
                }
            } else {
                /* write token word */
                uint8_t *tokenString=tokenStrings+token;
                while((c=*tokenString++)!=0) {
                    WRITE_CHAR(buffer, bufferLength, bufferPos, c);
                }
            }
        }
    }

    /* zero-terminate */
    if(bufferLength>0) {
        *buffer=0;
    }

    return bufferPos;
}